

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quoting.cpp
# Opt level: O0

pair<std::shared_ptr<SchemeObject>,_bool> *
do_quote(pair<std::shared_ptr<SchemeObject>,_bool> *__return_storage_ptr__,shared_ptr<ASTNode> *node
        ,Context *context,int quasi_level)

{
  size_t *this;
  bool bVar1;
  element_type *peVar2;
  size_type sVar3;
  __shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var4;
  reference psVar5;
  eval_error *peVar6;
  element_type *peVar7;
  reference obj;
  element_type *peVar8;
  bool local_221;
  shared_ptr<SchemeObject> local_220;
  shared_ptr<SchemeObject> local_210;
  bool local_1f9;
  shared_ptr<SchemePair> local_1f8;
  undefined1 local_1e8 [32];
  shared_ptr<SchemeObject> local_1c8;
  undefined1 local_1b8 [16];
  reverse_iterator j;
  shared_ptr<SchemePair> sublst;
  list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_> to_insert;
  undefined1 local_170 [8];
  pair<std::shared_ptr<SchemeObject>,_bool> quoted;
  undefined1 local_150 [8];
  reverse_iterator i;
  int local_140;
  bool dotted;
  int taken;
  undefined1 local_118 [23];
  bool local_101;
  ExecutionResult local_100;
  undefined1 local_e0 [16];
  undefined1 local_d0 [8];
  string head;
  shared_ptr<SchemePair> lst;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  shared_ptr<SchemeObject> local_78;
  bool local_65 [13];
  ExecutionResult local_58;
  undefined1 local_38 [28];
  int quasi_level_local;
  Context *context_local;
  shared_ptr<ASTNode> *node_local;
  
  local_38._20_4_ = quasi_level;
  unique0x10000eff = (TailContext *)context;
  context_local = (Context *)node;
  node_local = (shared_ptr<ASTNode> *)__return_storage_ptr__;
  peVar2 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)node
                     );
  if ((((peVar2->type == STRING) ||
       (peVar2 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)node), peVar2->type == INT)) ||
      (peVar2 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                           )node), peVar2->type == FLOAT)) ||
     ((peVar2 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                           )node), peVar2->type == BOOL ||
      (peVar2 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                           )node), peVar2->type == CHAR)))) {
    peVar2 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        node);
    ASTNode::evaluate(&local_58,peVar2,(Context *)stack0xffffffffffffffe0);
    ExecutionResult::force_value((ExecutionResult *)local_38);
    local_65[0] = false;
    std::pair<std::shared_ptr<SchemeObject>,_bool>::pair<std::shared_ptr<SchemeObject>,_bool,_true>
              (__return_storage_ptr__,(shared_ptr<SchemeObject> *)local_38,local_65);
    std::shared_ptr<SchemeObject>::~shared_ptr((shared_ptr<SchemeObject> *)local_38);
    ExecutionResult::~ExecutionResult(&local_58);
    return __return_storage_ptr__;
  }
  peVar2 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)node
                     );
  if (peVar2->type == NAME) {
    std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)node);
    std::make_shared<SchemeSymbol,std::__cxx11::string&>(&local_98);
    std::shared_ptr<SchemeObject>::shared_ptr<SchemeSymbol,void>
              ((shared_ptr<SchemeObject> *)&local_98.field_2,(shared_ptr<SchemeSymbol> *)&local_98);
    to_object(&local_78);
    lst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
    std::pair<std::shared_ptr<SchemeObject>,_bool>::pair<std::shared_ptr<SchemeObject>,_bool,_true>
              (__return_storage_ptr__,&local_78,
               (bool *)((long)&lst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi + 7));
    std::shared_ptr<SchemeObject>::~shared_ptr(&local_78);
    std::shared_ptr<SchemeObject>::~shared_ptr((shared_ptr<SchemeObject> *)&local_98.field_2);
    std::shared_ptr<SchemeSymbol>::~shared_ptr((shared_ptr<SchemeSymbol> *)&local_98);
    return __return_storage_ptr__;
  }
  std::dynamic_pointer_cast<SchemePair,SchemeObject>
            ((shared_ptr<SchemeObject> *)((long)&head.field_2 + 8));
  if (0 < (int)local_38._20_4_) {
    peVar2 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        node);
    sVar3 = std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
            ::size(&peVar2->list);
    if (sVar3 != 0) {
      peVar2 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          node);
      p_Var4 = (__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::__cxx11::
               list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::front
                         (&peVar2->list);
      peVar2 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var4);
      if (peVar2->type == NAME) {
        peVar2 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)node);
        p_Var4 = (__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 std::__cxx11::
                 list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::front
                           (&peVar2->list);
        peVar2 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var4);
        std::__cxx11::string::string((string *)local_d0,(string *)&peVar2->value);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_d0,"unquote");
        if (bVar1) {
          if (local_38._20_4_ != 1) {
            local_38._20_4_ = local_38._20_4_ + -1;
            goto LAB_00190c6f;
          }
          peVar2 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)node);
          sVar3 = std::__cxx11::
                  list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::size
                            (&peVar2->list);
          if (sVar3 != 2) {
            peVar6 = (eval_error *)__cxa_allocate_exception(0x10);
            eval_error::runtime_error(peVar6,"unquote: one argument required");
            __cxa_throw(peVar6,&eval_error::typeinfo,eval_error::~eval_error);
          }
          peVar2 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)node);
          p_Var4 = (__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   std::__cxx11::
                   list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::back
                             (&peVar2->list);
          peVar2 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(p_Var4);
          ASTNode::evaluate(&local_100,peVar2,(Context *)stack0xffffffffffffffe0);
          ExecutionResult::force_value((ExecutionResult *)local_e0);
          local_101 = false;
          std::pair<std::shared_ptr<SchemeObject>,_bool>::
          pair<std::shared_ptr<SchemeObject>,_bool,_true>
                    (__return_storage_ptr__,(shared_ptr<SchemeObject> *)local_e0,&local_101);
          std::shared_ptr<SchemeObject>::~shared_ptr((shared_ptr<SchemeObject> *)local_e0);
          ExecutionResult::~ExecutionResult(&local_100);
          local_118._16_4_ = 1;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d0,"unquote-splicing");
          if (bVar1) {
            if (local_38._20_4_ == 1) {
              peVar2 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)node);
              sVar3 = std::__cxx11::
                      list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::
                      size(&peVar2->list);
              if (sVar3 != 2) {
                peVar6 = (eval_error *)__cxa_allocate_exception(0x10);
                eval_error::runtime_error(peVar6,"unquote-splicing: one argument required");
                __cxa_throw(peVar6,&eval_error::typeinfo,eval_error::~eval_error);
              }
              peVar2 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)node);
              p_Var4 = (__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       std::__cxx11::
                       list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::
                       back(&peVar2->list);
              peVar2 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->(p_Var4);
              ASTNode::evaluate((ExecutionResult *)&taken,peVar2,(Context *)stack0xffffffffffffffe0)
              ;
              ExecutionResult::force_value((ExecutionResult *)local_118);
              dotted = true;
              std::pair<std::shared_ptr<SchemeObject>,_bool>::
              pair<std::shared_ptr<SchemeObject>,_bool,_true>
                        (__return_storage_ptr__,(shared_ptr<SchemeObject> *)local_118,&dotted);
              std::shared_ptr<SchemeObject>::~shared_ptr((shared_ptr<SchemeObject> *)local_118);
              ExecutionResult::~ExecutionResult((ExecutionResult *)&taken);
              local_118._16_4_ = 1;
              goto LAB_00190c79;
            }
            local_38._20_4_ = local_38._20_4_ + -1;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_d0,"quasiquote");
            if (bVar1) {
              local_38._20_4_ = local_38._20_4_ + 1;
            }
          }
LAB_00190c6f:
          local_118._16_4_ = 0;
        }
LAB_00190c79:
        std::__cxx11::string::~string((string *)local_d0);
        if (local_118._16_4_ != 0) goto LAB_00191314;
      }
    }
  }
  local_140 = 0;
  i.current._M_node._7_1_ = 0;
  std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)node);
  std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::rbegin
            ((list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *)local_150
            );
  while( true ) {
    std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)node);
    std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::rend
              ((list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *)
               &quoted.second);
    bVar1 = std::operator!=((reverse_iterator<std::_List_iterator<std::shared_ptr<ASTNode>_>_> *)
                            local_150,
                            (reverse_iterator<std::_List_iterator<std::shared_ptr<ASTNode>_>_> *)
                            &quoted.second);
    if (!bVar1) break;
    psVar5 = std::reverse_iterator<std::_List_iterator<std::shared_ptr<ASTNode>_>_>::operator*
                       ((reverse_iterator<std::_List_iterator<std::shared_ptr<ASTNode>_>_> *)
                        local_150);
    this = &to_insert.
            super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
            ._M_impl._M_node._M_size;
    std::shared_ptr<ASTNode>::shared_ptr((shared_ptr<ASTNode> *)this,psVar5);
    do_quote((pair<std::shared_ptr<SchemeObject>,_bool> *)local_170,(shared_ptr<ASTNode> *)this,
             (Context *)stack0xffffffffffffffe0,local_38._20_4_);
    std::shared_ptr<ASTNode>::~shared_ptr
              ((shared_ptr<ASTNode> *)
               &to_insert.
                super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                ._M_impl._M_node._M_size);
    if (((byte)quoted.first.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi & 1) == 0) {
      p_Var4 = (__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::reverse_iterator<std::_List_iterator<std::shared_ptr<ASTNode>_>_>::operator*
                         ((reverse_iterator<std::_List_iterator<std::shared_ptr<ASTNode>_>_> *)
                          local_150);
      peVar2 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var4);
      if (peVar2->type == NAME) {
        p_Var4 = (__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 std::reverse_iterator<std::_List_iterator<std::shared_ptr<ASTNode>_>_>::operator*
                           ((reverse_iterator<std::_List_iterator<std::shared_ptr<ASTNode>_>_> *)
                            local_150);
        peVar2 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var4);
        bVar1 = std::operator==(&peVar2->value,".");
        if (!bVar1) goto LAB_001910db;
        if (local_140 != 1) {
          peVar6 = (eval_error *)__cxa_allocate_exception(0x10);
          eval_error::runtime_error(peVar6,"Invalid dotted sequence");
          __cxa_throw(peVar6,&eval_error::typeinfo,eval_error::~eval_error);
        }
        peVar7 = std::__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(head.field_2._M_local_buf + 8));
        peVar8 = std::__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(head.field_2._M_local_buf + 8));
        std::swap<SchemeObject>(&peVar7->car,&peVar8->cdr);
        i.current._M_node._7_1_ = 1;
      }
      else {
LAB_001910db:
        prepend_value((shared_ptr<SchemePair> *)((long)&head.field_2 + 8),
                      (shared_ptr<SchemeObject> *)local_170,(bool *)((long)&i.current._M_node + 7));
      }
      local_140 = local_140 + 1;
    }
    else {
      std::__cxx11::
      list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::list
                ((list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                  *)&sublst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      while (bVar1 = std::operator!=((shared_ptr<SchemeObject> *)local_170,&scheme_nil), bVar1) {
        std::dynamic_pointer_cast<SchemePair,SchemeObject>((shared_ptr<SchemeObject> *)&j);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&j);
        if (!bVar1) {
          peVar6 = (eval_error *)__cxa_allocate_exception(0x10);
          eval_error::runtime_error
                    (peVar6,"unquote-slicing: the expression did not evaluate to a list");
          __cxa_throw(peVar6,&eval_error::typeinfo,eval_error::~eval_error);
        }
        peVar7 = std::__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&j);
        std::__cxx11::
        list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::
        push_back((list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                   *)&sublst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                  &peVar7->car);
        peVar7 = std::__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&j);
        std::shared_ptr<SchemeObject>::operator=((shared_ptr<SchemeObject> *)local_170,&peVar7->cdr)
        ;
        std::shared_ptr<SchemePair>::~shared_ptr((shared_ptr<SchemePair> *)&j);
      }
      std::__cxx11::
      list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::rbegin
                ((list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                  *)(local_1b8 + 8));
      while( true ) {
        std::__cxx11::
        list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::rend
                  ((list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                    *)local_1b8);
        bVar1 = std::operator!=((reverse_iterator<std::_List_iterator<std::shared_ptr<SchemeObject>_>_>
                                 *)(local_1b8 + 8),
                                (reverse_iterator<std::_List_iterator<std::shared_ptr<SchemeObject>_>_>
                                 *)local_1b8);
        if (!bVar1) break;
        obj = std::reverse_iterator<std::_List_iterator<std::shared_ptr<SchemeObject>_>_>::operator*
                        ((reverse_iterator<std::_List_iterator<std::shared_ptr<SchemeObject>_>_> *)
                         (local_1b8 + 8));
        prepend_value((shared_ptr<SchemePair> *)((long)&head.field_2 + 8),obj,
                      (bool *)((long)&i.current._M_node + 7));
        local_140 = local_140 + 1;
        std::reverse_iterator<std::_List_iterator<std::shared_ptr<SchemeObject>_>_>::operator++
                  ((reverse_iterator<std::_List_iterator<std::shared_ptr<SchemeObject>_>_> *)
                   (local_1b8 + 8));
      }
      std::__cxx11::
      list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::~list
                ((list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                  *)&sublst.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    std::pair<std::shared_ptr<SchemeObject>,_bool>::~pair
              ((pair<std::shared_ptr<SchemeObject>,_bool> *)local_170);
    std::reverse_iterator<std::_List_iterator<std::shared_ptr<ASTNode>_>_>::operator++
              ((reverse_iterator<std::_List_iterator<std::shared_ptr<ASTNode>_>_> *)local_150);
  }
  peVar2 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)node
                     );
  if (peVar2->type == VECTOR) {
    std::shared_ptr<SchemePair>::shared_ptr
              (&local_1f8,(shared_ptr<SchemePair> *)((long)&head.field_2 + 8));
    SchemeVector::from_list((SchemeVector *)local_1e8,&local_1f8);
    std::shared_ptr<SchemeObject>::shared_ptr<SchemeVector,void>
              ((shared_ptr<SchemeObject> *)(local_1e8 + 0x10),(shared_ptr<SchemeVector> *)local_1e8)
    ;
    to_object(&local_1c8);
    local_1f9 = false;
    std::pair<std::shared_ptr<SchemeObject>,_bool>::pair<std::shared_ptr<SchemeObject>,_bool,_true>
              (__return_storage_ptr__,&local_1c8,&local_1f9);
    std::shared_ptr<SchemeObject>::~shared_ptr(&local_1c8);
    std::shared_ptr<SchemeObject>::~shared_ptr((shared_ptr<SchemeObject> *)(local_1e8 + 0x10));
    std::shared_ptr<SchemeVector>::~shared_ptr((shared_ptr<SchemeVector> *)local_1e8);
    std::shared_ptr<SchemePair>::~shared_ptr(&local_1f8);
    local_118._16_4_ = 1;
  }
  else {
    std::shared_ptr<SchemeObject>::shared_ptr<SchemePair,void>
              (&local_220,(shared_ptr<SchemePair> *)((long)&head.field_2 + 8));
    to_object(&local_210);
    local_221 = false;
    std::pair<std::shared_ptr<SchemeObject>,_bool>::pair<std::shared_ptr<SchemeObject>,_bool,_true>
              (__return_storage_ptr__,&local_210,&local_221);
    std::shared_ptr<SchemeObject>::~shared_ptr(&local_210);
    std::shared_ptr<SchemeObject>::~shared_ptr(&local_220);
    local_118._16_4_ = 1;
  }
LAB_00191314:
  std::shared_ptr<SchemePair>::~shared_ptr((shared_ptr<SchemePair> *)((long)&head.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::shared_ptr<SchemeObject>, bool>
do_quote(std::shared_ptr<ASTNode> node, const Context &context, int quasi_level)
{
    if(node->type == ast_type_t::STRING || node->type == ast_type_t::INT || node->type == ast_type_t::FLOAT ||
       node->type == ast_type_t::BOOL || node->type == ast_type_t::CHAR)
    {
        return {node->evaluate(context).force_value(), false};
    }
    if(node->type == ast_type_t::NAME)
    {
        return {to_object(std::make_shared<SchemeSymbol>(node->value)), false};
    }
    auto lst = std::dynamic_pointer_cast<SchemePair>(scheme_nil);
    if(quasi_level > 0 && node->list.size() && node->list.front()->type == ast_type_t::NAME)
    {
        auto head = node->list.front()->value;
        if(head == "unquote")
        {
            if(quasi_level == 1)
            {
                if(node->list.size() != 2)
                    throw eval_error("unquote: one argument required");
                return {node->list.back()->evaluate(context).force_value(), false};
            }
            --quasi_level;
        }
        else if(head == "unquote-splicing")
        {
            if(quasi_level == 1)
            {
                if(node->list.size() != 2)
                    throw eval_error("unquote-splicing: one argument required");
                return {node->list.back()->evaluate(context).force_value(), true};
            }
            --quasi_level;
        }
        else if(head == "quasiquote")
            ++quasi_level;
    }
    int taken = 0;
    bool dotted = false;
    for(auto i = node->list.rbegin(); i != node->list.rend(); ++i)
    {
        auto quoted = do_quote(*i, context, quasi_level);
        if(quoted.second)
        {
            std::list<std::shared_ptr<SchemeObject>> to_insert;
            while(quoted.first != scheme_nil)
            {
                auto sublst = std::dynamic_pointer_cast<SchemePair>(quoted.first);
                if(!sublst)
                    throw eval_error("unquote-slicing: the expression did not evaluate to a list");
                to_insert.push_back(sublst->car);
                quoted.first = sublst->cdr;
            }
            for(auto j = to_insert.rbegin(); j != to_insert.rend(); ++j)
            {
                prepend_value(lst, *j, dotted);
                ++taken;
            }
        }
        else if((*i)->type == ast_type_t::NAME && (*i)->value == ".")
        {
            if(taken != 1)
                throw eval_error("Invalid dotted sequence");
            std::swap(lst->car, lst->cdr);
            dotted = true;
            ++taken;
        }
        else
        {
            prepend_value(lst, quoted.first, dotted);
            ++taken;
        }
    }
    if(node->type == ast_type_t::VECTOR)
        return {to_object(SchemeVector::from_list(lst)), false};
    return {to_object(lst), false};
}